

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.cpp
# Opt level: O3

void __thiscall
OpticsParser::WLData::WLData
          (WLData *this,double wavelength,double tfDirect,double tfDiffuse,double tbDirect,
          double tbDiffuse,double rfDirect,double rfDiffuse,double rbDirect,double rbDiffuse)

{
  this->wavelength = wavelength;
  (this->directComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.tf
       = tfDirect;
  (this->directComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.tb
       = tbDirect;
  (this->directComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.rf
       = rfDirect;
  (this->directComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.rb
       = rbDirect;
  (this->directComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_engaged = true;
  (this->diffuseComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.tf
       = tfDiffuse;
  (this->diffuseComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.tb
       = tbDiffuse;
  (this->diffuseComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.rf
       = rfDiffuse;
  (this->diffuseComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_payload._M_value.rb
       = rbDiffuse;
  (this->diffuseComponent).super__Optional_base<OpticsParser::MeasurementComponent,_true,_true>.
  _M_payload.super__Optional_payload_base<OpticsParser::MeasurementComponent>._M_engaged = true;
  (this->pvComponent).super__Optional_base<OpticsParser::PVWavelengthData,_true,_true>._M_payload.
  super__Optional_payload_base<OpticsParser::PVWavelengthData>._M_engaged = false;
  return;
}

Assistant:

OpticsParser::WLData::WLData(double wavelength,
                             double tfDirect,
                             double tfDiffuse,
                             double tbDirect,
                             double tbDiffuse,
                             double rfDirect,
                             double rfDiffuse,
                             double rbDirect,
                             double rbDiffuse) :
    wavelength(wavelength),
    directComponent(MeasurementComponent{tfDirect, tbDirect, rfDirect, rbDirect}),
    diffuseComponent(MeasurementComponent{tfDiffuse, tbDiffuse, rfDiffuse, rbDiffuse})
{}